

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void Memory::Recycler::WBVerifyBitIsSet(char *addr,char *target)

{
  HeapBlock *pHVar1;
  Recycler *pRVar2;
  
  CCLock::Enter(&recyclerListLock.super_CCLock);
  pRVar2 = recyclerList;
  do {
    if (pRVar2 == (Recycler *)0x0) {
LAB_00723ac8:
      CCLock::Leave(&recyclerListLock.super_CCLock);
      return;
    }
    if (addr < (char *)0x10000) {
      pHVar1 = (HeapBlock *)0x0;
    }
    else {
      pHVar1 = HeapBlockMap64::GetHeapBlock
                         (&pRVar2->heapBlockMap,(void *)((ulong)addr & 0xfffffffffffffff0));
    }
    if (pHVar1 != (HeapBlock *)0x0) {
      (*pHVar1->_vptr_HeapBlock[3])(pHVar1,addr);
      goto LAB_00723ac8;
    }
    pRVar2 = pRVar2->next;
  } while( true );
}

Assistant:

void
Recycler::WBVerifyBitIsSet(char* addr, char* target)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            heapBlock->WBVerifyBitIsSet(addr);
            break;
        }
        recycler = recycler->next;
    }
}